

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O1

void printDualSolution<double>
               (SoPlexBase<double> *soplex,NameSet *colnames,NameSet *rownames,bool real,
               bool rational)

{
  Tolerances *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ostream *poVar3;
  long lVar4;
  char cVar5;
  void *pvVar6;
  pointer pnVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  SPxOut *pSVar13;
  Verbosity old_verbosity;
  Verbosity VVar14;
  long lVar15;
  undefined3 in_register_00000081;
  undefined4 uVar16;
  char *pcVar17;
  Verbosity old_verbosity_1;
  long lVar18;
  Real RVar19;
  double dVar20;
  Verbosity old_verbosity_8;
  VectorBase<double> redcost;
  VectorBase<double> dual;
  VectorRational redcost_1;
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_190;
  data_type local_178;
  undefined5 local_168;
  char cStack_163;
  char cStack_162;
  undefined1 uStack_161;
  uint local_158;
  void *local_150;
  char local_143;
  char local_142;
  NameSet *local_138;
  undefined4 local_12c;
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_128;
  NameSet *local_110;
  SPxOut *local_108;
  longlong local_100;
  data_type local_f8;
  char local_e3;
  char local_e2;
  uint local_d8;
  void *local_d0;
  char local_c3;
  char local_c2;
  data_type local_b8;
  char local_a3;
  char local_a2;
  uint local_98;
  void *local_90;
  char local_83;
  char local_82;
  data_type local_78;
  char local_63;
  char local_62;
  uint local_58;
  void *local_50;
  char local_43;
  char local_42;
  
  uVar16 = CONCAT31(in_register_00000081,rational);
  pTVar1 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  RVar19 = ::soplex::Tolerances::epsilon(pTVar1);
  dVar20 = log10(RVar19);
  iVar9 = (int)-dVar20;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  iVar10 = iVar9 + 10;
  local_138 = rownames;
  local_110 = colnames;
  if (!real) goto LAB_0012fbeb;
  ::soplex::VectorBase<double>::VectorBase
            ((VectorBase<double> *)&local_178.ld,
             (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  bVar8 = ::soplex::SoPlexBase<double>::getDualFarkas(soplex,(VectorBase<double> *)&local_178.ld);
  local_12c = uVar16;
  if (bVar8) {
    VVar14 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar14) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"\nDual ray (name, value):\n",0x19);
      (soplex->spxout).m_verbosity = VVar14;
    }
    if (0 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
      lVar15 = 0;
      do {
        dVar20 = *(double *)(CONCAT44(local_178.la[0]._4_4_,local_178.ld.capacity) + lVar15 * 8);
        pTVar1 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var2 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        RVar19 = ::soplex::Tolerances::epsilon(pTVar1);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        if ((RVar19 < ABS(dVar20)) && (VVar14 = (soplex->spxout).m_verbosity, 2 < (int)VVar14)) {
          (soplex->spxout).m_verbosity = INFO1;
          poVar3 = (soplex->spxout).m_streams[3];
          if (rownames->mem == (char *)0x0) {
            std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
          }
          else {
            pcVar17 = rownames->mem +
                      (rownames->set).theitem[(rownames->set).thekey[lVar15].idx].data;
            sVar12 = strlen(pcVar17);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar17,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
          poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          lVar18 = *(long *)poVar3;
          *(long *)(poVar3 + *(long *)(lVar18 + -0x18) + 0x10) = (long)iVar10;
          *(long *)(poVar3 + *(long *)(lVar18 + -0x18) + 8) = (long)iVar9;
          std::ostream::_M_insert<double>
                    (*(double *)(CONCAT44(local_178.la[0]._4_4_,local_178.ld.capacity) + lVar15 * 8)
                    );
          poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          cVar5 = (char)poVar3;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          (soplex->spxout).m_verbosity = VVar14;
          rownames = local_138;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                        thenum);
    }
    VVar14 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar14) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"All other entries are zero (within ",0x23);
      poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      lVar15 = *(long *)poVar3;
      *(undefined8 *)(poVar3 + *(long *)(lVar15 + -0x18) + 8) = 1;
      lVar15 = *(long *)(lVar15 + -0x18);
      *(uint *)(poVar3 + lVar15 + 0x18) = *(uint *)(poVar3 + lVar15 + 0x18) & 0xfffffefb | 0x100;
      pTVar1 = (soplex->_tolerances).
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = (soplex->_tolerances).
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      RVar19 = ::soplex::Tolerances::epsilon(pTVar1);
      std::ostream::_M_insert<double>(RVar19);
      poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      lVar15 = *(long *)poVar3;
      *(undefined8 *)(poVar3 + *(long *)(lVar15 + -0x18) + 8) = 8;
      lVar15 = *(long *)(lVar15 + -0x18);
      *(uint *)(poVar3 + lVar15 + 0x18) = *(uint *)(poVar3 + lVar15 + 0x18) & 0xfffffefb | 4;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,").",2);
      poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      cVar5 = (char)poVar3;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
LAB_0012fbca:
      (soplex->spxout).m_verbosity = VVar14;
    }
  }
  else if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0x98 & 4) != 0)) ||
           ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 4) != 0)))) &&
          (bVar8 = ::soplex::SoPlexBase<double>::getDual(soplex,(VectorBase<double> *)&local_178.ld)
          , bVar8)) {
    VVar14 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar14) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"\nDual solution (name, value):\n",0x1e);
      (soplex->spxout).m_verbosity = VVar14;
    }
    if (0 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
      lVar15 = 0;
      do {
        dVar20 = *(double *)(CONCAT44(local_178.la[0]._4_4_,local_178.ld.capacity) + lVar15 * 8);
        pTVar1 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var2 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        RVar19 = ::soplex::Tolerances::epsilon(pTVar1);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        if ((RVar19 < ABS(dVar20)) && (VVar14 = (soplex->spxout).m_verbosity, 2 < (int)VVar14)) {
          (soplex->spxout).m_verbosity = INFO1;
          poVar3 = (soplex->spxout).m_streams[3];
          if (rownames->mem == (char *)0x0) {
            std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
          }
          else {
            pcVar17 = rownames->mem +
                      (rownames->set).theitem[(rownames->set).thekey[lVar15].idx].data;
            sVar12 = strlen(pcVar17);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar17,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
          poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          lVar18 = *(long *)poVar3;
          *(long *)(poVar3 + *(long *)(lVar18 + -0x18) + 0x10) = (long)iVar10;
          *(long *)(poVar3 + *(long *)(lVar18 + -0x18) + 8) = (long)iVar9;
          std::ostream::_M_insert<double>
                    (*(double *)(CONCAT44(local_178.la[0]._4_4_,local_178.ld.capacity) + lVar15 * 8)
                    );
          poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          cVar5 = (char)poVar3;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          (soplex->spxout).m_verbosity = VVar14;
          rownames = local_138;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                        thenum);
    }
    VVar14 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar14) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"All other dual values are zero (within ",0x27);
      poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      lVar15 = *(long *)poVar3;
      *(undefined8 *)(poVar3 + *(long *)(lVar15 + -0x18) + 8) = 1;
      lVar15 = *(long *)(lVar15 + -0x18);
      *(uint *)(poVar3 + lVar15 + 0x18) = *(uint *)(poVar3 + lVar15 + 0x18) & 0xfffffefb | 0x100;
      pTVar1 = (soplex->_tolerances).
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = (soplex->_tolerances).
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      RVar19 = ::soplex::Tolerances::epsilon(pTVar1);
      std::ostream::_M_insert<double>(RVar19);
      poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      lVar15 = *(long *)poVar3;
      *(undefined8 *)(poVar3 + *(long *)(lVar15 + -0x18) + 8) = 8;
      lVar15 = *(long *)(lVar15 + -0x18);
      *(uint *)(poVar3 + lVar15 + 0x18) = *(uint *)(poVar3 + lVar15 + 0x18) & 0xfffffefb | 4;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,").",2);
      poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      cVar5 = (char)poVar3;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      (soplex->spxout).m_verbosity = VVar14;
    }
    ::soplex::VectorBase<double>::VectorBase
              ((VectorBase<double> *)&local_190,
               (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    bVar8 = ::soplex::SoPlexBase<double>::getRedCost(soplex,(VectorBase<double> *)&local_190);
    if (bVar8) {
      pSVar13 = &soplex->spxout;
      VVar14 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar14) {
        (soplex->spxout).m_verbosity = INFO1;
        ::soplex::operator<<(pSVar13,"\nReduced costs (name, value):\n");
        (soplex->spxout).m_verbosity = VVar14;
      }
      local_108 = pSVar13;
      if (0 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
        lVar15 = 0;
        do {
          dVar20 = *(double *)
                    ((long)&((local_190.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.num.
                            m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar15 * 8);
          pTVar1 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var2 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
          RVar19 = ::soplex::Tolerances::epsilon(pTVar1);
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if ((RVar19 < ABS(dVar20)) && (VVar14 = (soplex->spxout).m_verbosity, 2 < (int)VVar14)) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar3 = (soplex->spxout).m_streams[3];
            if (local_110->mem == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar3 + -0x18) + (int)poVar3);
            }
            else {
              pcVar17 = local_110->mem +
                        (local_110->set).theitem[(local_110->set).thekey[lVar15].idx].data;
              sVar12 = strlen(pcVar17);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar17,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            lVar18 = *(long *)poVar3;
            *(long *)(poVar3 + *(long *)(lVar18 + -0x18) + 0x10) = (long)iVar10;
            *(long *)(poVar3 + *(long *)(lVar18 + -0x18) + 8) = (long)iVar9;
            std::ostream::_M_insert<double>
                      ((double)((local_190.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.num.
                               m_backend.
                               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                               .m_data.la[lVar15]);
            poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar5 = (char)poVar3;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
            (soplex->spxout).m_verbosity = VVar14;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                          thenum);
      }
      VVar14 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar14) {
        (soplex->spxout).m_verbosity = INFO1;
        pSVar13 = ::soplex::operator<<(local_108,"All other reduced costs are zero (within ");
        poVar3 = pSVar13->m_streams[pSVar13->m_verbosity];
        lVar15 = *(long *)poVar3;
        *(undefined8 *)(poVar3 + *(long *)(lVar15 + -0x18) + 8) = 1;
        lVar15 = *(long *)(lVar15 + -0x18);
        *(uint *)(poVar3 + lVar15 + 0x18) = *(uint *)(poVar3 + lVar15 + 0x18) & 0xfffffefb | 0x100;
        pTVar1 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var2 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        RVar19 = ::soplex::Tolerances::epsilon(pTVar1);
        std::ostream::_M_insert<double>(RVar19);
        poVar3 = pSVar13->m_streams[pSVar13->m_verbosity];
        lVar15 = *(long *)poVar3;
        *(undefined8 *)(poVar3 + *(long *)(lVar15 + -0x18) + 8) = 8;
        lVar15 = *(long *)(lVar15 + -0x18);
        *(uint *)(poVar3 + lVar15 + 0x18) = *(uint *)(poVar3 + lVar15 + 0x18) & 0xfffffefb | 4;
        pSVar13 = ::soplex::operator<<(pSVar13,").");
        std::endl<char,std::char_traits<char>>(pSVar13->m_streams[pSVar13->m_verbosity]);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        (soplex->spxout).m_verbosity = VVar14;
      }
    }
    if (local_190.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_190.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_190.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_190.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    VVar14 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar14) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"No dual information available.\n",0x1f);
      goto LAB_0012fbca;
    }
  }
  pvVar6 = (void *)CONCAT44(local_178.la[0]._4_4_,local_178.ld.capacity);
  uVar16 = local_12c;
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,CONCAT17(uStack_161,CONCAT16(cStack_162,CONCAT15(cStack_163,local_168)))
                           - (long)pvVar6);
    uVar16 = local_12c;
  }
LAB_0012fbeb:
  if ((char)uVar16 != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)&local_190,
                 (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    bVar8 = ::soplex::SoPlexBase<double>::getDualFarkasRational
                      (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               *)&local_190);
    if (bVar8) {
      VVar14 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar14) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nDual ray (name, value):\n",0x19);
        (soplex->spxout).m_verbosity = VVar14;
      }
      if (0 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
        lVar18 = 0;
        lVar15 = 0;
        do {
          pnVar7 = local_190.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_128.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_178.ld,(longlong *)&local_128,(type *)0x0);
          iVar11 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&(pnVar7->m_backend).m_value.num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar18),
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_178.ld);
          if ((local_143 == '\0') && (local_142 == '\0')) {
            operator_delete(local_150,(ulong)local_158 << 3);
          }
          if ((cStack_163 == '\0') && (cStack_162 == '\0')) {
            operator_delete(local_178.ld.data,(ulong)local_178.ld.capacity << 3);
          }
          if ((iVar11 != 0) && (VVar14 = (soplex->spxout).m_verbosity, 2 < (int)VVar14)) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar3 = (soplex->spxout).m_streams[3];
            if (local_138->mem == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar3 + -0x18) + (int)poVar3);
            }
            else {
              pcVar17 = local_138->mem +
                        (local_138->set).theitem[(local_138->set).thekey[lVar15].idx].data;
              sVar12 = strlen(pcVar17);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar17,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            lVar4 = *(long *)poVar3;
            *(long *)(poVar3 + *(long *)(lVar4 + -0x18) + 0x10) = (long)iVar10;
            *(long *)(poVar3 + *(long *)(lVar4 + -0x18) + 8) = (long)iVar9;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_78.ld,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)((long)&((local_190.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                          m_value.num.m_backend.
                                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                          .m_data + lVar18));
            boost::multiprecision::operator<<
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                       (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_78.ld);
            poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar5 = (char)poVar3;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
            if ((local_43 == '\0') && (local_42 == '\0')) {
              operator_delete(local_50,(ulong)local_58 << 3);
            }
            if ((local_63 == '\0') && (local_62 == '\0')) {
              operator_delete(local_78.ld.data,(ulong)local_78.ld.capacity << 3);
            }
            (soplex->spxout).m_verbosity = VVar14;
          }
          lVar15 = lVar15 + 1;
          lVar18 = lVar18 + 0x40;
        } while (lVar15 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                          thenum);
      }
      VVar14 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar14) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other entries are zero.",0x1b);
        poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar5 = (char)poVar3;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        (soplex->spxout).m_verbosity = VVar14;
      }
    }
    if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0x98 & 4) != 0)) ||
        ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 4) != 0)))) &&
       (bVar8 = ::soplex::SoPlexBase<double>::getDualRational
                          (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)&local_190), bVar8)) {
      VVar14 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar14) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nDual solution (name, value):\n",0x1e);
        (soplex->spxout).m_verbosity = VVar14;
      }
      if (0 < (soplex->_rationalLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .set.thenum) {
        lVar15 = 0;
        lVar18 = 0;
        do {
          pnVar7 = local_190.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_128.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_178.ld,(longlong *)&local_128,(type *)0x0);
          iVar9 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)((long)&(pnVar7->m_backend).m_value.num.m_backend.
                                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                       .m_data + lVar15),
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_178.ld);
          if ((local_143 == '\0') && (local_142 == '\0')) {
            operator_delete(local_150,(ulong)local_158 << 3);
          }
          if ((cStack_163 == '\0') && (cStack_162 == '\0')) {
            operator_delete(local_178.ld.data,(ulong)local_178.ld.capacity << 3);
          }
          if ((iVar9 != 0) && (VVar14 = (soplex->spxout).m_verbosity, 2 < (int)VVar14)) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar3 = (soplex->spxout).m_streams[3];
            if (local_138->mem == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar3 + -0x18) + (int)poVar3);
            }
            else {
              pcVar17 = local_138->mem +
                        (local_138->set).theitem[(local_138->set).thekey[lVar18].idx].data;
              sVar12 = strlen(pcVar17);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar17,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_b8.ld,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)((long)&((local_190.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                          m_value.num.m_backend.
                                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                          .m_data + lVar15));
            boost::multiprecision::operator<<
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                       (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_b8.ld);
            poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar5 = (char)poVar3;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
            if ((local_83 == '\0') && (local_82 == '\0')) {
              operator_delete(local_90,(ulong)local_98 << 3);
            }
            if ((local_a3 == '\0') && (local_a2 == '\0')) {
              operator_delete(local_b8.ld.data,(ulong)local_b8.ld.capacity << 3);
            }
            (soplex->spxout).m_verbosity = VVar14;
          }
          lVar18 = lVar18 + 1;
          lVar15 = lVar15 + 0x40;
        } while (lVar18 < (soplex->_rationalLP->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          .set.thenum);
      }
      VVar14 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar14) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other dual values are zero.",0x1f);
        poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar5 = (char)poVar3;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        (soplex->spxout).m_verbosity = VVar14;
      }
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_128,
                   (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum)
      ;
      bVar8 = ::soplex::SoPlexBase<double>::getRedCostRational(soplex,(VectorRational *)&local_128);
      if (bVar8) {
        VVar14 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar14) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"\nReduced costs (name, value):\n",0x1e);
          (soplex->spxout).m_verbosity = VVar14;
        }
        if (0 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
          lVar15 = 0;
          lVar18 = 0;
          do {
            pnVar7 = local_128.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_100 = 0;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_178.ld,&local_100,(type *)0x0);
            iVar9 = boost::multiprecision::backends::
                    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)((long)&(pnVar7->m_backend).m_value.num.m_backend.
                                         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                         .m_data + lVar15),
                              (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)&local_178.ld);
            if ((local_143 == '\0') && (local_142 == '\0')) {
              operator_delete(local_150,(ulong)local_158 << 3);
            }
            if ((cStack_163 == '\0') && (cStack_162 == '\0')) {
              operator_delete(local_178.ld.data,(ulong)local_178.ld.capacity << 3);
            }
            if ((iVar9 != 0) && (VVar14 = (soplex->spxout).m_verbosity, 2 < (int)VVar14)) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar3 = (soplex->spxout).m_streams[3];
              if (local_110->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar3 + -0x18) + (int)poVar3);
              }
              else {
                pcVar17 = local_110->mem +
                          (local_110->set).theitem[(local_110->set).thekey[lVar18].idx].data;
                sVar12 = strlen(pcVar17);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar17,sVar12);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)&local_f8.ld,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)((long)&((local_128.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->m_backend)
                                            .m_value.num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar15));
              boost::multiprecision::operator<<
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)&local_f8.ld);
              poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar5 = (char)poVar3;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
              std::ostream::put(cVar5);
              std::ostream::flush();
              if ((local_c3 == '\0') && (local_c2 == '\0')) {
                operator_delete(local_d0,(ulong)local_d8 << 3);
              }
              if ((local_e3 == '\0') && (local_e2 == '\0')) {
                operator_delete(local_f8.ld.data,(ulong)local_f8.ld.capacity << 3);
              }
              (soplex->spxout).m_verbosity = VVar14;
            }
            lVar18 = lVar18 + 1;
            lVar15 = lVar15 + 0x40;
          } while (lVar18 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.
                            set.thenum);
        }
        VVar14 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar14) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"All other reduced costs are zero.",0x21);
          poVar3 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          cVar5 = (char)poVar3;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          (soplex->spxout).m_verbosity = VVar14;
        }
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ::~vector(&local_128);
    }
    else {
      VVar14 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar14) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No dual (rational) solution available.\n",0x27);
        (soplex->spxout).m_verbosity = VVar14;
      }
    }
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::~vector(&local_190);
  }
  return;
}

Assistant:

static
void printDualSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                       bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> dual(soplex.numRows());

      if(soplex.getDualFarkas(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual ray (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed << ")." << std::endl;)
      }
      else if(soplex.isDualFeasible() && soplex.getDual(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual solution (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other dual values are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed << ")." << std::endl;)

         VectorBase<R> redcost(soplex.numCols());

         if(soplex.getRedCost(redcost))
         {
            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nReduced costs (name, value):\n";)

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(isNotZero(redcost[i], soplex.tolerances()->epsilon()))
               {
                  SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                                << std::setw(printwidth) << std::setprecision(printprec)
                                << redcost[i] << std::endl;)
               }
            }

            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other reduced costs are zero (within "
                          << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                          << std::setprecision(8) << std::fixed << ")." << std::endl;)
         }
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual information available.\n")
      }

   if(rational)
   {
      VectorRational dual(soplex.numRows());

      if(soplex.getDualFarkasRational(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual ray (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(dual[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth)
                             << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isDualFeasible() && soplex.getDualRational(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual solution (name, value):\n";)

         for(int i = 0; i < soplex.numRowsRational(); ++i)
         {
            if(dual[i] != (Rational) 0)
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t" << dual[i] << std::endl;)
            }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other dual values are zero." << std::endl;)

         VectorRational redcost(soplex.numCols());

         if(soplex.getRedCostRational(redcost))
         {
            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nReduced costs (name, value):\n";)

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(redcost[i] != (Rational) 0)
                  SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << redcost[i] << std::endl;)
               }

            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other reduced costs are zero." << std::endl;)
         }
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual (rational) solution available.\n")
      }
}